

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

void __thiscall Solver_MCSVM_CS::Solve(Solver_MCSVM_CS *this,double *w)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  bool bVar13;
  bool bVar14;
  int iVar15;
  ulong uVar16;
  void *pvVar17;
  double *alpha_new_00;
  void *pvVar18;
  void *pvVar19;
  void *pvVar20;
  void *pvVar21;
  void *pvVar22;
  void *pvVar23;
  void *pvVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  double dVar28;
  uint local_104;
  double dStack_100;
  int nSV;
  double v;
  double *w_i_1;
  double d;
  double dStack_e0;
  int nz_d;
  double maxG;
  double minG;
  double *w_i;
  feature_node *xi_1;
  int *alpha_index_i;
  double *alpha_i;
  double Ai;
  double dStack_a0;
  int j;
  double stopping;
  double val;
  feature_node *xi;
  double dStack_80;
  bool start_from_all;
  double eps_shrink;
  int *active_size_i;
  int active_size;
  int *y_index;
  int *alpha_index;
  double *d_val;
  int *d_ind;
  double *QD;
  int *index;
  double *alpha_new;
  double *alpha;
  int iter;
  int s;
  int m;
  int i;
  double *w_local;
  Solver_MCSVM_CS *this_local;
  
  alpha._0_4_ = 0;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(this->l * this->nr_class);
  uVar16 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  pvVar17 = operator_new__(uVar16);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)this->nr_class;
  uVar16 = SUB168(auVar5 * ZEXT816(8),0);
  if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  alpha_new_00 = (double *)operator_new__(uVar16);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)this->l;
  uVar16 = SUB168(auVar6 * ZEXT816(4),0);
  if (SUB168(auVar6 * ZEXT816(4),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  pvVar18 = operator_new__(uVar16);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (long)this->l;
  uVar16 = SUB168(auVar7 * ZEXT816(8),0);
  if (SUB168(auVar7 * ZEXT816(8),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  pvVar19 = operator_new__(uVar16);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (long)this->nr_class;
  uVar16 = SUB168(auVar8 * ZEXT816(4),0);
  if (SUB168(auVar8 * ZEXT816(4),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  pvVar20 = operator_new__(uVar16);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (long)this->nr_class;
  uVar16 = SUB168(auVar9 * ZEXT816(8),0);
  if (SUB168(auVar9 * ZEXT816(8),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  pvVar21 = operator_new__(uVar16);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = (long)(this->nr_class * this->l);
  uVar16 = SUB168(auVar10 * ZEXT816(4),0);
  if (SUB168(auVar10 * ZEXT816(4),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  pvVar22 = operator_new__(uVar16);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = (long)this->l;
  uVar16 = SUB168(auVar11 * ZEXT816(4),0);
  if (SUB168(auVar11 * ZEXT816(4),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  pvVar23 = operator_new__(uVar16);
  active_size_i._4_4_ = this->l;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (long)this->l;
  uVar16 = SUB168(auVar12 * ZEXT816(4),0);
  if (SUB168(auVar12 * ZEXT816(4),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  pvVar24 = operator_new__(uVar16);
  dStack_80 = max<double>(this->eps * 10.0,1.0);
  bVar13 = true;
  for (s = 0; s < this->l * this->nr_class; s = s + 1) {
    *(undefined8 *)((long)pvVar17 + (long)s * 8) = 0;
  }
  for (s = 0; s < this->w_size * this->nr_class; s = s + 1) {
    w[s] = 0.0;
  }
  for (s = 0; s < this->l; s = s + 1) {
    for (iter = 0; iter < this->nr_class; iter = iter + 1) {
      *(int *)((long)pvVar22 + (long)(s * this->nr_class + iter) * 4) = iter;
    }
    val = (double)this->prob->x[s];
    *(undefined8 *)((long)pvVar19 + (long)s * 8) = 0;
    for (; *(int *)val != -1; val = (double)((long)val + 0x10)) {
      *(double *)((long)pvVar19 + (long)s * 8) =
           *(double *)((long)val + 8) * *(double *)((long)val + 8) +
           *(double *)((long)pvVar19 + (long)s * 8);
    }
    *(int *)((long)pvVar24 + (long)s * 4) = this->nr_class;
    *(int *)((long)pvVar23 + (long)s * 4) = (int)this->prob->y[s];
    *(int *)((long)pvVar18 + (long)s * 4) = s;
  }
  while ((int)(uint)alpha < this->max_iter) {
    dStack_a0 = -INFINITY;
    for (s = 0; s < active_size_i._4_4_; s = s + 1) {
      iVar15 = rand();
      swap<int>((int *)((long)pvVar18 + (long)s * 4),
                (int *)((long)pvVar18 + (long)(s + iVar15 % (active_size_i._4_4_ - s)) * 4));
    }
    for (alpha._4_4_ = 0; alpha._4_4_ < active_size_i._4_4_; alpha._4_4_ = alpha._4_4_ + 1) {
      iVar15 = *(int *)((long)pvVar18 + (long)alpha._4_4_ * 4);
      dVar28 = *(double *)((long)pvVar19 + (long)iVar15 * 8);
      iVar25 = iVar15 * this->nr_class;
      iVar26 = iVar15 * this->nr_class;
      if (0.0 < dVar28) {
        for (iter = 0; iter < *(int *)((long)pvVar24 + (long)iVar15 * 4); iter = iter + 1) {
          this->G[iter] = 1.0;
        }
        if (*(int *)((long)pvVar23 + (long)iVar15 * 4) < *(int *)((long)pvVar24 + (long)iVar15 * 4))
        {
          this->G[*(int *)((long)pvVar23 + (long)iVar15 * 4)] = 0.0;
        }
        for (w_i = (double *)this->prob->x[iVar15]; *(int *)w_i != -1; w_i = w_i + 2) {
          iVar2 = *(int *)w_i;
          iVar3 = this->nr_class;
          for (iter = 0; iter < *(int *)((long)pvVar24 + (long)iVar15 * 4); iter = iter + 1) {
            this->G[iter] =
                 w[(long)((iVar2 + -1) * iVar3) +
                   (long)*(int *)((long)pvVar22 + (long)iter * 4 + (long)iVar26 * 4)] * w_i[1] +
                 this->G[iter];
          }
        }
        maxG = INFINITY;
        dStack_e0 = -INFINITY;
        for (iter = 0; iter < *(int *)((long)pvVar24 + (long)iVar15 * 4); iter = iter + 1) {
          pdVar1 = (double *)
                   ((long)pvVar17 +
                   (long)*(int *)((long)pvVar22 + (long)iter * 4 + (long)iVar26 * 4) * 8 +
                   (long)iVar25 * 8);
          if ((*pdVar1 <= 0.0 && *pdVar1 != 0.0) && (this->G[iter] < maxG)) {
            maxG = this->G[iter];
          }
          if (dStack_e0 < this->G[iter]) {
            dStack_e0 = this->G[iter];
          }
        }
        if (((*(int *)((long)pvVar23 + (long)iVar15 * 4) <
              *(int *)((long)pvVar24 + (long)iVar15 * 4)) &&
            (*(double *)((long)pvVar17 + (long)(int)this->prob->y[iVar15] * 8 + (long)iVar25 * 8) <
             this->C[(int)this->prob->y[iVar15]])) &&
           (this->G[*(int *)((long)pvVar23 + (long)iVar15 * 4)] < maxG)) {
          maxG = this->G[*(int *)((long)pvVar23 + (long)iVar15 * 4)];
        }
        for (iter = 0; iter < *(int *)((long)pvVar24 + (long)iVar15 * 4); iter = iter + 1) {
          bVar14 = be_shrunk(this,iVar15,iter,*(int *)((long)pvVar23 + (long)iVar15 * 4),
                             *(double *)
                              ((long)pvVar17 +
                              (long)*(int *)((long)pvVar22 + (long)iter * 4 + (long)iVar26 * 4) * 8
                              + (long)iVar25 * 8),maxG);
          if (bVar14) {
            *(int *)((long)pvVar24 + (long)iVar15 * 4) =
                 *(int *)((long)pvVar24 + (long)iVar15 * 4) + -1;
            while (iter < *(int *)((long)pvVar24 + (long)iVar15 * 4)) {
              bVar14 = be_shrunk(this,iVar15,*(int *)((long)pvVar24 + (long)iVar15 * 4),
                                 *(int *)((long)pvVar23 + (long)iVar15 * 4),
                                 *(double *)
                                  ((long)pvVar17 +
                                  (long)*(int *)((long)pvVar22 +
                                                (long)*(int *)((long)pvVar24 + (long)iVar15 * 4) * 4
                                                + (long)iVar26 * 4) * 8 + (long)iVar25 * 8),maxG);
              if (!bVar14) {
                swap<int>((int *)((long)pvVar22 + (long)iter * 4 + (long)iVar26 * 4),
                          (int *)((long)pvVar22 +
                                 (long)*(int *)((long)pvVar24 + (long)iVar15 * 4) * 4 +
                                 (long)iVar26 * 4));
                swap<double>(this->G + iter,this->G + *(int *)((long)pvVar24 + (long)iVar15 * 4));
                if (*(int *)((long)pvVar23 + (long)iVar15 * 4) ==
                    *(int *)((long)pvVar24 + (long)iVar15 * 4)) {
                  *(int *)((long)pvVar23 + (long)iVar15 * 4) = iter;
                }
                else if (*(int *)((long)pvVar23 + (long)iVar15 * 4) == iter) {
                  *(undefined4 *)((long)pvVar23 + (long)iVar15 * 4) =
                       *(undefined4 *)((long)pvVar24 + (long)iVar15 * 4);
                }
                break;
              }
              *(int *)((long)pvVar24 + (long)iVar15 * 4) =
                   *(int *)((long)pvVar24 + (long)iVar15 * 4) + -1;
            }
          }
        }
        if (*(int *)((long)pvVar24 + (long)iVar15 * 4) < 2) {
          active_size_i._4_4_ = active_size_i._4_4_ + -1;
          swap<int>((int *)((long)pvVar18 + (long)alpha._4_4_ * 4),
                    (int *)((long)pvVar18 + (long)active_size_i._4_4_ * 4));
          alpha._4_4_ = alpha._4_4_ + -1;
        }
        else if (1e-12 < dStack_e0 - maxG) {
          dStack_a0 = max<double>(dStack_e0 - maxG,dStack_a0);
          for (iter = 0; iter < *(int *)((long)pvVar24 + (long)iVar15 * 4); iter = iter + 1) {
            this->B[iter] =
                 -dVar28 * *(double *)
                            ((long)pvVar17 +
                            (long)*(int *)((long)pvVar22 + (long)iter * 4 + (long)iVar26 * 4) * 8 +
                            (long)iVar25 * 8) + this->G[iter];
          }
          solve_sub_problem(this,dVar28,*(int *)((long)pvVar23 + (long)iVar15 * 4),
                            this->C[(int)this->prob->y[iVar15]],
                            *(int *)((long)pvVar24 + (long)iVar15 * 4),alpha_new_00);
          d._4_4_ = 0;
          for (iter = 0; iter < *(int *)((long)pvVar24 + (long)iVar15 * 4); iter = iter + 1) {
            dVar28 = alpha_new_00[iter] -
                     *(double *)
                      ((long)pvVar17 +
                      (long)*(int *)((long)pvVar22 + (long)iter * 4 + (long)iVar26 * 4) * 8 +
                      (long)iVar25 * 8);
            *(double *)
             ((long)pvVar17 +
             (long)*(int *)((long)pvVar22 + (long)iter * 4 + (long)iVar26 * 4) * 8 +
             (long)iVar25 * 8) = alpha_new_00[iter];
            if (1e-12 <= ABS(dVar28)) {
              *(undefined4 *)((long)pvVar20 + (long)d._4_4_ * 4) =
                   *(undefined4 *)((long)pvVar22 + (long)iter * 4 + (long)iVar26 * 4);
              *(double *)((long)pvVar21 + (long)d._4_4_ * 8) = dVar28;
              d._4_4_ = d._4_4_ + 1;
            }
          }
          for (w_i = (double *)this->prob->x[iVar15]; *(int *)w_i != -1; w_i = w_i + 2) {
            iVar15 = (*(int *)w_i + -1) * this->nr_class;
            for (iter = 0; iter < d._4_4_; iter = iter + 1) {
              lVar27 = (long)*(int *)((long)pvVar20 + (long)iter * 4);
              w[iVar15 + lVar27] =
                   *(double *)((long)pvVar21 + (long)iter * 8) * w_i[1] + w[iVar15 + lVar27];
            }
          }
        }
      }
    }
    alpha._0_4_ = (uint)alpha + 1;
    if ((int)(uint)alpha % 10 == 0) {
      info(".");
    }
    if (dStack_80 <= dStack_a0) {
      bVar13 = false;
    }
    else {
      if ((dStack_a0 < this->eps) && (bVar13)) break;
      active_size_i._4_4_ = this->l;
      for (s = 0; s < this->l; s = s + 1) {
        *(int *)((long)pvVar24 + (long)s * 4) = this->nr_class;
      }
      info("*");
      dStack_80 = max<double>(dStack_80 / 2.0,this->eps);
      bVar13 = true;
    }
  }
  info("\noptimization finished, #iter = %d\n",(ulong)(uint)alpha);
  if (this->max_iter <= (int)(uint)alpha) {
    info("\nWARNING: reaching max number of iterations\n");
  }
  dStack_100 = 0.0;
  local_104 = 0;
  for (s = 0; s < this->w_size * this->nr_class; s = s + 1) {
    dStack_100 = w[s] * w[s] + dStack_100;
  }
  dStack_100 = dStack_100 * 0.5;
  for (s = 0; s < this->l * this->nr_class; s = s + 1) {
    dStack_100 = *(double *)((long)pvVar17 + (long)s * 8) + dStack_100;
    if (0.0 < ABS(*(double *)((long)pvVar17 + (long)s * 8))) {
      local_104 = local_104 + 1;
    }
  }
  for (s = 0; s < this->l; s = s + 1) {
    dStack_100 = dStack_100 -
                 *(double *)((long)pvVar17 + (long)(s * this->nr_class + (int)this->prob->y[s]) * 8)
    ;
  }
  info("Objective value = %lf\n",dStack_100);
  info("nSV = %d\n",(ulong)local_104);
  if (pvVar17 != (void *)0x0) {
    operator_delete__(pvVar17);
  }
  if (alpha_new_00 != (double *)0x0) {
    operator_delete__(alpha_new_00);
  }
  if (pvVar18 != (void *)0x0) {
    operator_delete__(pvVar18);
  }
  if (pvVar19 != (void *)0x0) {
    operator_delete__(pvVar19);
  }
  if (pvVar20 != (void *)0x0) {
    operator_delete__(pvVar20);
  }
  if (pvVar21 != (void *)0x0) {
    operator_delete__(pvVar21);
  }
  if (pvVar22 != (void *)0x0) {
    operator_delete__(pvVar22);
  }
  if (pvVar23 != (void *)0x0) {
    operator_delete__(pvVar23);
  }
  if (pvVar24 != (void *)0x0) {
    operator_delete__(pvVar24);
  }
  return;
}

Assistant:

void Solver_MCSVM_CS::Solve(double *w)
{
	int i, m, s;
	int iter = 0;
	double *alpha =  new double[l*nr_class];
	double *alpha_new = new double[nr_class];
	int *index = new int[l];
	double *QD = new double[l];
	int *d_ind = new int[nr_class];
	double *d_val = new double[nr_class];
	int *alpha_index = new int[nr_class*l];
	int *y_index = new int[l];
	int active_size = l;
	int *active_size_i = new int[l];
	double eps_shrink = max(10.0*eps, 1.0); // stopping tolerance for shrinking
	bool start_from_all = true;

	// Initial alpha can be set here. Note that 
	// sum_m alpha[i*nr_class+m] = 0, for all i=1,...,l-1
	// alpha[i*nr_class+m] <= C[GETI(i)] if prob->y[i] == m
	// alpha[i*nr_class+m] <= 0 if prob->y[i] != m
	// If initial alpha isn't zero, uncomment the for loop below to initialize w
	for(i=0;i<l*nr_class;i++)
		alpha[i] = 0;

	for(i=0;i<w_size*nr_class;i++)
		w[i] = 0;
	for(i=0;i<l;i++)
	{
		for(m=0;m<nr_class;m++)
			alpha_index[i*nr_class+m] = m;
		feature_node *xi = prob->x[i];
		QD[i] = 0;
		while(xi->index != -1)
		{
			double val = xi->value;
			QD[i] += val*val;

			// Uncomment the for loop if initial alpha isn't zero
			// for(m=0; m<nr_class; m++)
			//	w[(xi->index-1)*nr_class+m] += alpha[i*nr_class+m]*val;
			xi++;
		}
		active_size_i[i] = nr_class;
		y_index[i] = (int)prob->y[i];
		index[i] = i;
	}

	while(iter < max_iter)
	{
		double stopping = -INF;
		for(i=0;i<active_size;i++)
		{
			int j = i+rand()%(active_size-i);
			swap(index[i], index[j]);
		}
		for(s=0;s<active_size;s++)
		{
			i = index[s];
			double Ai = QD[i];
			double *alpha_i = &alpha[i*nr_class];
			int *alpha_index_i = &alpha_index[i*nr_class];

			if(Ai > 0)
			{
				for(m=0;m<active_size_i[i];m++)
					G[m] = 1;
				if(y_index[i] < active_size_i[i])
					G[y_index[i]] = 0;

				feature_node *xi = prob->x[i];
				while(xi->index!= -1)
				{
					double *w_i = &w[(xi->index-1)*nr_class];
					for(m=0;m<active_size_i[i];m++)
						G[m] += w_i[alpha_index_i[m]]*(xi->value);
					xi++;
				}

				double minG = INF;
				double maxG = -INF;
				for(m=0;m<active_size_i[i];m++)
				{
					if(alpha_i[alpha_index_i[m]] < 0 && G[m] < minG)
						minG = G[m];
					if(G[m] > maxG)
						maxG = G[m];
				}
				if(y_index[i] < active_size_i[i])
					if(alpha_i[(int) prob->y[i]] < C[GETI(i)] && G[y_index[i]] < minG)
						minG = G[y_index[i]];

				for(m=0;m<active_size_i[i];m++)
				{
					if(be_shrunk(i, m, y_index[i], alpha_i[alpha_index_i[m]], minG))
					{
						active_size_i[i]--;
						while(active_size_i[i]>m)
						{
							if(!be_shrunk(i, active_size_i[i], y_index[i],
											alpha_i[alpha_index_i[active_size_i[i]]], minG))
							{
								swap(alpha_index_i[m], alpha_index_i[active_size_i[i]]);
								swap(G[m], G[active_size_i[i]]);
								if(y_index[i] == active_size_i[i])
									y_index[i] = m;
								else if(y_index[i] == m)
									y_index[i] = active_size_i[i];
								break;
							}
							active_size_i[i]--;
						}
					}
				}

				if(active_size_i[i] <= 1)
				{
					active_size--;
					swap(index[s], index[active_size]);
					s--;
					continue;
				}

				if(maxG-minG <= 1e-12)
					continue;
				else
					stopping = max(maxG - minG, stopping);

				for(m=0;m<active_size_i[i];m++)
					B[m] = G[m] - Ai*alpha_i[alpha_index_i[m]] ;

				solve_sub_problem(Ai, y_index[i], C[GETI(i)], active_size_i[i], alpha_new);
				int nz_d = 0;
				for(m=0;m<active_size_i[i];m++)
				{
					double d = alpha_new[m] - alpha_i[alpha_index_i[m]];
					alpha_i[alpha_index_i[m]] = alpha_new[m];
					if(fabs(d) >= 1e-12)
					{
						d_ind[nz_d] = alpha_index_i[m];
						d_val[nz_d] = d;
						nz_d++;
					}
				}

				xi = prob->x[i];
				while(xi->index != -1)
				{
					double *w_i = &w[(xi->index-1)*nr_class];
					for(m=0;m<nz_d;m++)
						w_i[d_ind[m]] += d_val[m]*xi->value;
					xi++;
				}
			}
		}

		iter++;
		if(iter % 10 == 0)
		{
			info(".");
		}

		if(stopping < eps_shrink)
		{
			if(stopping < eps && start_from_all == true)
				break;
			else
			{
				active_size = l;
				for(i=0;i<l;i++)
					active_size_i[i] = nr_class;
				info("*");
				eps_shrink = max(eps_shrink/2, eps);
				start_from_all = true;
			}
		}
		else
			start_from_all = false;
	}

	info("\noptimization finished, #iter = %d\n",iter);
	if (iter >= max_iter)
		info("\nWARNING: reaching max number of iterations\n");

	// calculate objective value
	double v = 0;
	int nSV = 0;
	for(i=0;i<w_size*nr_class;i++)
		v += w[i]*w[i];
	v = 0.5*v;
	for(i=0;i<l*nr_class;i++)
	{
		v += alpha[i];
		if(fabs(alpha[i]) > 0)
			nSV++;
	}
	for(i=0;i<l;i++)
		v -= alpha[i*nr_class+(int)prob->y[i]];
	info("Objective value = %lf\n",v);
	info("nSV = %d\n",nSV);

	delete [] alpha;
	delete [] alpha_new;
	delete [] index;
	delete [] QD;
	delete [] d_ind;
	delete [] d_val;
	delete [] alpha_index;
	delete [] y_index;
	delete [] active_size_i;
}